

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsTextureStateQueryTests.cpp
# Opt level: O3

RequiredExtensions *
deqp::gls::TextureStateQueryTests::anon_unknown_1::getTextureParamExtension
          (RequiredExtensions *__return_storage_ptr__,ContextType *contextType,GLenum pname)

{
  bool bVar1;
  undefined1 extraout_AL;
  undefined7 extraout_var;
  undefined7 extraout_var_00;
  undefined7 extraout_var_01;
  undefined7 extraout_var_02;
  undefined7 uVar2;
  char *ext;
  
  bVar1 = glu::contextSupports((ContextType)(contextType->super_ApiType).m_bits,(ApiType)0x23);
  uVar2 = extraout_var;
  if (!bVar1) {
    bVar1 = glu::contextSupports((ContextType)(contextType->super_ApiType).m_bits,(ApiType)0x13);
    if (!bVar1) {
      bVar1 = glu::contextSupports((ContextType)(contextType->super_ApiType).m_bits,(ApiType)0x3);
      uVar2 = extraout_var_02;
      goto LAB_00919b02;
    }
    uVar2 = extraout_var_00;
    if (pname == 0x1004) {
      ext = "GL_EXT_texture_border_clamp";
      goto LAB_00919ae9;
    }
  }
  if (pname == 0x8a48) {
    ext = "GL_EXT_texture_sRGB_decode";
LAB_00919ae9:
    RequiredExtensions::RequiredExtensions(__return_storage_ptr__,ext);
    return (RequiredExtensions *)CONCAT71(extraout_var_01,extraout_AL);
  }
LAB_00919b02:
  (__return_storage_ptr__->m_extensions).
  super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (__return_storage_ptr__->m_extensions).
  super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (__return_storage_ptr__->m_extensions).
  super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  return (RequiredExtensions *)CONCAT71(uVar2,bVar1);
}

Assistant:

static RequiredExtensions getTextureParamExtension (const glu::ContextType& contextType, glw::GLenum pname)
{
	DE_ASSERT(!isCoreTextureParam(contextType, pname));

	if (contextSupports(contextType, glu::ApiType::es(3,2)))
		return es32::getTextureParamExtension(pname);
	else if (contextSupports(contextType, glu::ApiType::es(3,1)))
		return es31::getTextureParamExtension(pname);
	else if (contextSupports(contextType, glu::ApiType::es(3,0)))
		return es30::getTextureParamExtension(pname);
	else
	{
		DE_ASSERT(false);
		return RequiredExtensions();
	}
}